

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O2

void MWT::print_scalars(int f,v_array<float> *scalars,v_array<char> *tag)

{
  float *pfVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  size_t i_1;
  size_t i;
  ulong uVar5;
  void *local_1d8;
  ulong local_1d0;
  stringstream ss;
  ostream local_1a8;
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    for (uVar5 = 0; pfVar1 = scalars->_begin,
        uVar5 < (ulong)((long)scalars->_end - (long)pfVar1 >> 2); uVar5 = uVar5 + 1) {
      if (uVar5 != 0) {
        std::operator<<(&local_1a8,' ');
        pfVar1 = scalars->_begin;
      }
      std::ostream::operator<<(&local_1a8,pfVar1[uVar5]);
    }
    for (uVar5 = 0; pcVar4 = tag->_begin, uVar5 < (ulong)((long)tag->_end - (long)pcVar4);
        uVar5 = uVar5 + 1) {
      if (uVar5 == 0) {
        std::operator<<(&local_1a8,' ');
        pcVar4 = tag->_begin;
      }
      std::operator<<(&local_1a8,pcVar4[uVar5]);
    }
    std::operator<<(&local_1a8,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringbuf::str();
    uVar5 = io_buf::write_file_or_socket(f,local_1d8,local_1d0 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar5 != local_1d0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void print_scalars(int f, v_array<float>& scalars, v_array<char>& tag)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < scalars.size(); i++)
    {
      if (i > 0)
        ss << ' ';
      ss << scalars[i];
    }
    for (size_t i = 0; i < tag.size(); i++)
    {
      if (i == 0)
        ss << ' ';
      ss << tag[i];
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}